

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-expr.c
# Opt level: O2

coda_expression *
coda_expression_new(coda_expression_node_type tag,char *string_value,coda_expression *op1,
                   coda_expression *op2,coda_expression *op3,coda_expression *op4)

{
  long lVar1;
  ulong uVar2;
  coda_expression_type cVar3;
  uint uVar4;
  coda_expression *pcVar5;
  size_t sVar6;
  undefined8 uVar7;
  char cVar8;
  long lVar9;
  undefined8 uVar10;
  long lVar11;
  bool bVar12;
  double local_40;
  coda_expression *local_38;
  
  switch(tag) {
  case expr_constant_boolean:
    pcVar5 = (coda_expression *)malloc(0x14);
    if (pcVar5 == (coda_expression *)0x0) {
      coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x14,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                     ,0xe8);
    }
    else {
      pcVar5->tag = expr_constant_boolean;
      pcVar5->result_type = coda_expression_boolean;
      pcVar5->is_constant = 1;
      pcVar5->recursion_depth = 0;
      pcVar5[1].tag = (uint)((*string_value & 0xdfU) == 0x54);
    }
LAB_00134a6b:
    free(string_value);
    return pcVar5;
  case expr_constant_float:
    sVar6 = strlen(string_value);
    lVar9 = coda_ascii_parse_double(string_value,sVar6,&local_40,0);
    free(string_value);
    if (lVar9 < 0) {
      return (coda_expression *)0x0;
    }
    pcVar5 = (coda_expression *)malloc(0x18);
    if (pcVar5 != (coda_expression *)0x0) {
      pcVar5->tag = expr_constant_float;
      pcVar5->result_type = coda_expression_float;
      pcVar5->is_constant = 1;
      pcVar5->recursion_depth = 0;
      *(double *)(pcVar5 + 1) = local_40;
      return pcVar5;
    }
    uVar7 = 0x18;
    uVar10 = 0x106;
    break;
  case expr_constant_integer:
    sVar6 = strlen(string_value);
    lVar9 = coda_ascii_parse_int64(string_value,sVar6,(int64_t *)&local_40,0);
    free(string_value);
    if (lVar9 < 0) {
      return (coda_expression *)0x0;
    }
    pcVar5 = (coda_expression *)malloc(0x18);
    if (pcVar5 != (coda_expression *)0x0) {
      pcVar5->tag = expr_constant_integer;
      pcVar5->result_type = coda_expression_integer;
      pcVar5->is_constant = 1;
      pcVar5->recursion_depth = 0;
      *(double *)(pcVar5 + 1) = local_40;
      return pcVar5;
    }
    uVar7 = 0x18;
    uVar10 = 0x122;
    break;
  case expr_constant_rawstring:
    pcVar5 = (coda_expression *)malloc(0x20);
    if (pcVar5 != (coda_expression *)0x0) {
      pcVar5->tag = expr_constant_rawstring;
      pcVar5->result_type = coda_expression_string;
      pcVar5->is_constant = 1;
      pcVar5->recursion_depth = 0;
      sVar6 = strlen(string_value);
      pcVar5[1].tag = (int)sVar6;
      pcVar5[1].result_type = (int)(sVar6 >> 0x20);
      *(char **)&pcVar5[1].is_constant = string_value;
      return pcVar5;
    }
    uVar7 = 0x20;
    uVar10 = 0x136;
    break;
  case expr_constant_string:
    if (string_value != (char *)0x0) {
      lVar9 = 0;
      lVar11 = 0;
      do {
        cVar8 = string_value[lVar9];
        if (cVar8 == '\\') {
          lVar1 = lVar9 + 1;
          cVar8 = string_value[lVar9 + 1];
          switch(cVar8) {
          case '\\':
            string_value[lVar11] = '\\';
            lVar9 = lVar1;
            break;
          case ']':
          case '^':
          case '_':
          case '`':
          case 'c':
          case 'd':
switchD_0013473c_caseD_6f:
            if (0xf5 < (byte)(cVar8 - 0x3aU)) {
              string_value[lVar11] = cVar8 * '@';
              if (0xf5 < (byte)(string_value[lVar9 + 2] - 0x3aU)) {
                cVar8 = (string_value[lVar9 + 2] & 0xfU) * '\b' + cVar8 * '@';
                string_value[lVar11] = cVar8;
                lVar1 = lVar9 + 3;
                if (0xf5 < (byte)(string_value[lVar1] - 0x3aU)) {
                  lVar9 = lVar9 + 3;
                  string_value[lVar11] = cVar8 + string_value[lVar1] + -0x30;
                  break;
                }
              }
            }
            pcVar5 = (coda_expression *)0x0;
            coda_set_error(-0x67,"invalid escape sequence in string");
            goto LAB_00134a6b;
          case 'a':
            string_value[lVar11] = '\a';
            lVar9 = lVar1;
            break;
          case 'b':
            string_value[lVar11] = '\b';
            lVar9 = lVar1;
            break;
          case 'e':
            string_value[lVar11] = '\x1b';
            lVar9 = lVar1;
            break;
          case 'f':
            string_value[lVar11] = '\f';
            lVar9 = lVar1;
            break;
          default:
            switch(cVar8) {
            case 'n':
              string_value[lVar11] = '\n';
              lVar9 = lVar1;
              break;
            case 'o':
            case 'p':
            case 'q':
            case 's':
            case 'u':
              goto switchD_0013473c_caseD_6f;
            case 'r':
              string_value[lVar11] = '\r';
              lVar9 = lVar1;
              break;
            case 't':
              string_value[lVar11] = '\t';
              lVar9 = lVar1;
              break;
            case 'v':
              string_value[lVar11] = '\v';
              lVar9 = lVar1;
              break;
            default:
              if (cVar8 == '\"') {
                string_value[lVar11] = '\"';
                lVar9 = lVar1;
              }
              else {
                if (cVar8 != '\'') goto switchD_0013473c_caseD_6f;
                string_value[lVar11] = '\'';
                lVar9 = lVar1;
              }
            }
          }
        }
        else {
          if (cVar8 == '\0') goto LAB_0013496f;
          string_value[lVar11] = cVar8;
        }
        lVar11 = lVar11 + 1;
        lVar9 = lVar9 + 1;
      } while( true );
    }
    lVar11 = 0;
    goto LAB_00134979;
  default:
    if (tag == expr_neg) {
      if (op1->tag == expr_constant_integer) {
        *(long *)(op1 + 1) = -*(long *)(op1 + 1);
        return op1;
      }
      if (op1->tag == expr_constant_float) {
        uVar2._0_4_ = op1[1].tag;
        uVar2._4_4_ = op1[1].result_type;
        op1[1].tag = (int)(uVar2 ^ 0x8000000000000000);
        op1[1].result_type = (int)((uVar2 ^ 0x8000000000000000) >> 0x20);
        return op1;
      }
    }
    local_38 = op4;
    pcVar5 = (coda_expression *)malloc(0x38);
    if (pcVar5 == (coda_expression *)0x0) {
      coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x38,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                     ,0x188);
      free(string_value);
      if (op1 != (coda_expression *)0x0) {
        coda_expression_delete(op1);
      }
      if (op2 != (coda_expression *)0x0) {
        coda_expression_delete(op2);
      }
      if (op3 != (coda_expression *)0x0) {
        coda_expression_delete(op3);
      }
      if (local_38 != (coda_expression *)0x0) {
        coda_expression_delete(local_38);
      }
      return (coda_expression *)0x0;
    }
    pcVar5->tag = tag;
    *(char **)(pcVar5 + 1) = string_value;
    *(coda_expression **)&pcVar5[1].is_constant = op1;
    *(coda_expression **)(pcVar5 + 2) = op2;
    *(coda_expression **)&pcVar5[2].is_constant = op3;
    *(coda_expression **)(pcVar5 + 3) = local_38;
    bVar12 = false;
    switch(tag) {
    case expr_abs:
    case expr_neg:
      cVar3 = op1->result_type;
      break;
    case expr_add:
    case expr_divide:
    case expr_max:
    case expr_min:
    case expr_modulo:
    case expr_multiply:
    case expr_subtract:
      cVar3 = op1->result_type;
      if (cVar3 == coda_expression_float) goto switchD_001346cb_caseD_11;
      if (op2->result_type == coda_expression_float) {
        cVar3 = coda_expression_float;
      }
      break;
    case expr_and:
    case expr_array_count:
    case expr_array_index:
    case expr_bit_offset:
    case expr_bit_size:
    case expr_byte_offset:
    case expr_byte_size:
    case expr_dim:
    case expr_file_size:
    case expr_index:
    case expr_index_var:
    case expr_integer:
    case expr_length:
    case expr_num_dims:
    case expr_num_elements:
    case expr_or:
    case expr_product_version:
    case expr_unbound_array_index:
    case expr_variable_index:
    case expr_variable_value:
      cVar3 = coda_expression_integer;
      break;
    case expr_array_add:
    case expr_array_max:
    case expr_array_min:
    case expr_at:
    case expr_if:
    case expr_with:
      cVar3 = op2->result_type;
      break;
    case expr_array_all:
    case expr_array_exists:
    case expr_equal:
    case expr_exists:
    case expr_greater_equal:
    case expr_greater:
    case expr_isinf:
    case expr_ismininf:
    case expr_isnan:
    case expr_isplusinf:
    case expr_less_equal:
    case expr_less:
    case expr_logical_and:
    case expr_logical_or:
    case expr_not_equal:
    case expr_not:
    case expr_variable_exists:
      cVar3 = coda_expression_boolean;
      break;
    case expr_asciiline:
    case expr_goto_array_element:
    case expr_goto_attribute:
    case expr_goto_begin:
    case expr_goto_field:
    case expr_goto_here:
    case expr_goto_parent:
    case expr_goto_root:
      cVar3 = coda_expression_node;
      break;
    case expr_bytes:
    case expr_filename:
    case expr_ltrim:
    case expr_product_class:
    case expr_product_format:
    case expr_product_type:
    case expr_rtrim:
    case expr_string:
    case expr_strtime:
    case expr_substr:
    case expr_trim:
      cVar3 = coda_expression_string;
      break;
    case expr_ceil:
    case expr_float:
    case expr_floor:
    case expr_power:
    case expr_round:
    case expr_time:
switchD_001346cb_caseD_11:
      cVar3 = coda_expression_float;
      break;
    default:
      goto switchD_001346cb_caseD_12;
    case expr_for:
    case expr_goto:
    case expr_sequence:
    case expr_variable_set:
      cVar3 = coda_expression_void;
      break;
    case expr_regex:
      pcVar5->result_type = (uint)(op3 != (coda_expression *)0x0) * 3;
      goto LAB_00134b6c;
    }
    pcVar5->result_type = cVar3;
    bVar12 = cVar3 == coda_expression_node;
switchD_001346cb_caseD_12:
    if (((0x3a < tag - expr_file_size) ||
        (uVar4 = 0, (0x7000f0000000003U >> ((ulong)(tag - expr_file_size) & 0x3f) & 1) == 0)) &&
       (uVar4 = 0, !bVar12)) {
LAB_00134b6c:
      if ((((op1 == (coda_expression *)0x0) || (op1->is_constant != 0)) &&
          ((op2 == (coda_expression *)0x0 || (op2->is_constant != 0)))) &&
         ((op3 == (coda_expression *)0x0 || (op3->is_constant != 0)))) {
        if (local_38 == (coda_expression *)0x0) {
          uVar4 = 1;
        }
        else {
          uVar4 = (uint)(local_38->is_constant != 0);
        }
      }
      else {
        uVar4 = 0;
      }
    }
    pcVar5->is_constant = uVar4;
    pcVar5->recursion_depth = 0;
    uVar4 = 0;
    if ((op1 != (coda_expression *)0x0) && (-1 < op1->recursion_depth)) {
      uVar4 = op1->recursion_depth + 1;
      pcVar5->recursion_depth = uVar4;
    }
    if ((op2 != (coda_expression *)0x0) && ((int)uVar4 <= op2->recursion_depth)) {
      uVar4 = op2->recursion_depth + 1;
      pcVar5->recursion_depth = uVar4;
    }
    if ((op3 != (coda_expression *)0x0) && ((int)uVar4 <= op3->recursion_depth)) {
      uVar4 = op3->recursion_depth + 1;
      pcVar5->recursion_depth = uVar4;
    }
    if ((local_38 != (coda_expression *)0x0) && ((int)uVar4 <= local_38->recursion_depth)) {
      uVar4 = local_38->recursion_depth + 1;
      pcVar5->recursion_depth = uVar4;
    }
    if (uVar4 < 0x2711) {
      return pcVar5;
    }
    coda_set_error(-0x191,"maximum recursion depth (%ld) reached",10000);
    coda_expression_delete(pcVar5);
    return (coda_expression *)0x0;
  }
LAB_00134a48:
  coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",uVar7,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                 ,uVar10);
  return (coda_expression *)0x0;
LAB_0013496f:
  string_value[lVar11] = '\0';
LAB_00134979:
  pcVar5 = (coda_expression *)malloc(0x20);
  if (pcVar5 != (coda_expression *)0x0) {
    pcVar5->tag = expr_constant_string;
    pcVar5->result_type = coda_expression_string;
    pcVar5->is_constant = 1;
    pcVar5->recursion_depth = 0;
    pcVar5[1].tag = (int)lVar11;
    pcVar5[1].result_type = (int)((ulong)lVar11 >> 0x20);
    *(char **)&pcVar5[1].is_constant = string_value;
    return pcVar5;
  }
  uVar7 = 0x20;
  uVar10 = 0x153;
  goto LAB_00134a48;
}

Assistant:

coda_expression *coda_expression_new(coda_expression_node_type tag, char *string_value, coda_expression *op1,
                                     coda_expression *op2, coda_expression *op3, coda_expression *op4)
{
    coda_expression_operation *expr;

    switch (tag)
    {
        case expr_constant_boolean:
            return boolean_constant_new(string_value);
        case expr_constant_float:
            return float_constant_new(string_value);
        case expr_constant_integer:
            return integer_constant_new(string_value);
        case expr_constant_rawstring:
            return rawstring_constant_new(string_value);
        case expr_constant_string:
            return string_constant_new(string_value);
        default:
            break;
    }

    if (tag == expr_neg)
    {
        /* turn constant numbers into negative constant values */
        if (op1->tag == expr_constant_float)
        {
            ((coda_expression_float_constant *)op1)->value = -((coda_expression_float_constant *)op1)->value;
            return op1;
        }
        if (op1->tag == expr_constant_integer)
        {
            ((coda_expression_integer_constant *)op1)->value = -((coda_expression_integer_constant *)op1)->value;
            return op1;
        }
    }

    expr = malloc(sizeof(coda_expression_operation));
    if (expr == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)sizeof(coda_expression_operation), __FILE__, __LINE__);
        if (string_value != NULL)
        {
            free(string_value);
        }
        if (op1 != NULL)
        {
            coda_expression_delete(op1);
        }
        if (op2 != NULL)
        {
            coda_expression_delete(op2);
        }
        if (op3 != NULL)
        {
            coda_expression_delete(op3);
        }
        if (op4 != NULL)
        {
            coda_expression_delete(op4);
        }
        return NULL;
    }
    expr->tag = tag;
    expr->identifier = string_value;
    expr->operand[0] = op1;
    expr->operand[1] = op2;
    expr->operand[2] = op3;
    expr->operand[3] = op4;

    switch (tag)
    {
        case expr_array_all:
        case expr_array_exists:
        case expr_equal:
        case expr_exists:
        case expr_greater_equal:
        case expr_greater:
        case expr_isinf:
        case expr_ismininf:
        case expr_isnan:
        case expr_isplusinf:
        case expr_less_equal:
        case expr_less:
        case expr_logical_and:
        case expr_logical_or:
        case expr_not_equal:
        case expr_not:
        case expr_variable_exists:
            expr->result_type = coda_expression_boolean;
            break;
        case expr_power:
        case expr_ceil:
        case expr_float:
        case expr_floor:
        case expr_round:
        case expr_time:
            expr->result_type = coda_expression_float;
            break;
        case expr_and:
        case expr_array_count:
        case expr_array_index:
        case expr_bit_offset:
        case expr_bit_size:
        case expr_byte_offset:
        case expr_byte_size:
        case expr_dim:
        case expr_file_size:
        case expr_index:
        case expr_index_var:
        case expr_integer:
        case expr_length:
        case expr_num_dims:
        case expr_num_elements:
        case expr_or:
        case expr_product_version:
        case expr_unbound_array_index:
        case expr_variable_index:
        case expr_variable_value:
            expr->result_type = coda_expression_integer;
            break;
        case expr_bytes:
        case expr_filename:
        case expr_ltrim:
        case expr_product_class:
        case expr_product_format:
        case expr_product_type:
        case expr_rtrim:
        case expr_string:
        case expr_strtime:
        case expr_substr:
        case expr_trim:
            expr->result_type = coda_expression_string;
            break;
        case expr_for:
        case expr_goto:
        case expr_sequence:
        case expr_variable_set:
            expr->result_type = coda_expression_void;
            break;
        case expr_asciiline:
        case expr_goto_array_element:
        case expr_goto_attribute:
        case expr_goto_begin:
        case expr_goto_field:
        case expr_goto_here:
        case expr_goto_parent:
        case expr_goto_root:
            expr->result_type = coda_expression_node;
            break;
        case expr_abs:
        case expr_neg:
            expr->result_type = op1->result_type;
            break;
        case expr_add:
        case expr_divide:
        case expr_max:
        case expr_min:
        case expr_modulo:
        case expr_multiply:
        case expr_subtract:
            if (op1->result_type == coda_expression_float || op2->result_type == coda_expression_float)
            {
                /* allow one of the arguments to be an integer */
                expr->result_type = coda_expression_float;
            }
            else
            {
                expr->result_type = op1->result_type;
            }
            break;
        case expr_array_add:
        case expr_array_max:
        case expr_array_min:
        case expr_at:
        case expr_if:
        case expr_with:
            expr->result_type = op2->result_type;
            break;
        case expr_regex:
            if (op3 == NULL)
            {
                expr->result_type = coda_expression_boolean;
            }
            else
            {
                expr->result_type = coda_expression_string;
            }
            break;
        case expr_constant_boolean:
        case expr_constant_float:
        case expr_constant_integer:
        case expr_constant_rawstring:
        case expr_constant_string:
            assert(0);
            exit(1);
    }

    switch (expr->tag)
    {
        case expr_file_size:
        case expr_filename:
        case expr_product_class:
        case expr_product_format:
        case expr_product_type:
        case expr_product_version:
        case expr_variable_index:
        case expr_variable_set:
        case expr_variable_value:
            expr->is_constant = 0;
            break;
        default:
            expr->is_constant = expr->result_type != coda_expression_node && (op1 == NULL || op1->is_constant) &&
                (op2 == NULL || op2->is_constant) && (op3 == NULL || op3->is_constant) &&
                (op4 == NULL || op4->is_constant);
    }

    expr->recursion_depth = 0;
    if (op1 != NULL)
    {
        if (op1->recursion_depth + 1 > expr->recursion_depth)
        {
            expr->recursion_depth = op1->recursion_depth + 1;
        }
    }
    if (op2 != NULL)
    {
        if (op2->recursion_depth + 1 > expr->recursion_depth)
        {
            expr->recursion_depth = op2->recursion_depth + 1;
        }
    }
    if (op3 != NULL)
    {
        if (op3->recursion_depth + 1 > expr->recursion_depth)
        {
            expr->recursion_depth = op3->recursion_depth + 1;
        }
    }
    if (op4 != NULL)
    {
        if (op4->recursion_depth + 1 > expr->recursion_depth)
        {
            expr->recursion_depth = op4->recursion_depth + 1;
        }
    }
    if (expr->recursion_depth > CODA_MAX_RECURSION_DEPTH)
    {
        coda_set_error(CODA_ERROR_EXPRESSION, "maximum recursion depth (%ld) reached", CODA_MAX_RECURSION_DEPTH);
        coda_expression_delete((coda_expression *)expr);
        return NULL;
    }

    return (coda_expression *)expr;
}